

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O0

int Fra_FraigMiterStatus(Aig_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  int local_38;
  int local_34;
  int CountUndecided;
  int CountNonConst0;
  int CountConst0;
  int i;
  Aig_Obj_t *pChild;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  local_34 = 0;
  local_38 = 0;
  if (p->pData == (void *)0x0) {
    CountNonConst0 = 0;
    while( true ) {
      iVar2 = Aig_ManCoNum(p);
      iVar3 = Aig_ManRegNum(p);
      if (iVar2 - iVar3 <= CountNonConst0) break;
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,CountNonConst0);
      pAVar5 = Aig_ObjChild0(pAVar5);
      pAVar6 = Aig_ManConst0(p);
      if (pAVar5 != pAVar6) {
        pAVar6 = Aig_ManConst1(p);
        if (pAVar5 == pAVar6) {
          local_34 = local_34 + 1;
        }
        else {
          pAVar6 = Aig_Regular(pAVar5);
          iVar2 = Aig_ObjIsCi(pAVar6);
          if (iVar2 != 0) {
            pAVar6 = Aig_Regular(pAVar5);
            iVar2 = Aig_ObjCioId(pAVar6);
            if (iVar2 < p->nTruePis) {
              local_34 = local_34 + 1;
              goto LAB_007d9b8c;
            }
          }
          pAVar6 = Aig_Regular(pAVar5);
          uVar1 = *(ulong *)&pAVar6->field_0x18;
          uVar4 = Aig_IsComplement(pAVar5);
          if (((uint)(uVar1 >> 3) & 1) == uVar4) {
            local_38 = local_38 + 1;
          }
          else {
            local_34 = local_34 + 1;
          }
        }
      }
LAB_007d9b8c:
      CountNonConst0 = CountNonConst0 + 1;
    }
    if (local_34 == 0) {
      if (local_38 == 0) {
        p_local._4_4_ = 1;
      }
      else {
        p_local._4_4_ = -1;
      }
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

/* 
    Speculating reduction in the sequential case leads to an interesting 
    situation when a counter-ex may not refine any classes. This happens
    for non-constant equivalence classes. In such cases the representative
    of the class (proved by simulation to be non-constant) may be reduced 
    to a constant during the speculative reduction. The fraig-representative 
    of this representative node is a constant node, even though this is a 
    non-constant class. Experiments have shown that this situation happens 
    very often at the beginning of the refinement iteration when there are 
    many spurious candidate equivalence classes (especially if heavy-duty 
    simulatation of BMC was node used at the beginning). As a result, the 
    SAT solver run may return a counter-ex that  distinguishes the given 
    representative node from the constant-1 node but this counter-ex
    does not distinguish the nodes in the non-costant class... This is why 
    there is no check of refinement after a counter-ex in the sequential case.
*/

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Reports the status of the miter.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Fra_FraigMiterStatus( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pChild;
    int i, CountConst0 = 0, CountNonConst0 = 0, CountUndecided = 0;
    if ( p->pData )
        return 0;
    Aig_ManForEachPoSeq( p, pObj, i )
    {
        pChild = Aig_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Aig_ManConst0(p) )
        {
            CountConst0++;
            continue;
        }
        // check if the output is constant 1
        if ( pChild == Aig_ManConst1(p) )
        {
            CountNonConst0++;
            continue;
        }
        // check if the output is a primary input
        if ( Aig_ObjIsCi(Aig_Regular(pChild)) && Aig_ObjCioId(Aig_Regular(pChild)) < p->nTruePis )
        {
            CountNonConst0++;
            continue;
        }
        // check if the output can be not constant 0
        if ( Aig_Regular(pChild)->fPhase != (unsigned)Aig_IsComplement(pChild) )
        {
            CountNonConst0++;
            continue;
        }
        CountUndecided++;
    }
/*
    if ( p->pParams->fVerbose )
    {
        printf( "Miter has %d outputs. ", Aig_ManCoNum(p->pManAig) );
        printf( "Const0 = %d.  ", CountConst0 );
        printf( "NonConst0 = %d.  ", CountNonConst0 );
        printf( "Undecided = %d.  ", CountUndecided );
        printf( "\n" );
    }
*/
    if ( CountNonConst0 )
        return 0;
    if ( CountUndecided )
        return -1;
    return 1;
}